

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.c++
# Opt level: O2

bool __thiscall capnp::AnyList::Reader::operator==(Reader *this,Reader right)

{
  bool bVar1;
  Equality EVar2;
  Fault f;
  Fault local_10;
  
  EVar2 = equals(this,right);
  if (EVar2 == NOT_EQUAL) {
    bVar1 = false;
  }
  else {
    bVar1 = true;
    if (EVar2 != EQUAL) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[107]>
                (&local_10,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/any.c++"
                 ,0x108,FAILED,(char *)0x0,
                 "\"operator== cannot determine equality of capabilities; use equals() instead if you need to handle this case\""
                 ,(char (*) [107])
                  "operator== cannot determine equality of capabilities; use equals() instead if you need to handle this case"
                );
      kj::_::Debug::Fault::fatal(&local_10);
    }
  }
  return bVar1;
}

Assistant:

bool AnyList::Reader::operator==(AnyList::Reader right) const {
  switch(equals(right)) {
    case Equality::EQUAL:
      return true;
    case Equality::NOT_EQUAL:
      return false;
    case Equality::UNKNOWN_CONTAINS_CAPS:
      KJ_FAIL_REQUIRE(
        "operator== cannot determine equality of capabilities; use equals() instead if you need to handle this case");
  }
  KJ_UNREACHABLE;
}